

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O1

HTTP_CLIENT_RESULT
uhttp_client_open(HTTP_CLIENT_HANDLE handle,char *host,int port_num,
                 ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect,void *callback_ctx)

{
  ON_HTTP_OPEN_COMPLETE_CALLBACK *pp_Var1;
  RESPONSE_MESSAGE_STATE RVar2;
  bool bVar3;
  int iVar4;
  LOGGER_LOG p_Var5;
  HTTP_CLIENT_RESULT HVar6;
  char *pcVar7;
  
  if (handle == (HTTP_CLIENT_HANDLE)0x0 || host == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    HVar6 = HTTP_CLIENT_INVALID_ARG;
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return HTTP_CLIENT_INVALID_ARG;
    }
    pcVar7 = "Invalid handle value";
    iVar4 = 0x47c;
  }
  else {
    RVar2 = (handle->recv_msg).recv_state;
    if ((RVar2 < (state_parse_complete|state_process_headers)) &&
       ((0xc01U >> (RVar2 & 0x1f) & 1) != 0)) {
      if (handle->host_name != (char *)0x0) {
        free(handle->host_name);
        handle->host_name = (char *)0x0;
      }
      iVar4 = mallocAndStrcpy_s(&handle->host_name,host);
      if (iVar4 == 0) {
        (handle->recv_msg).recv_state = state_opening;
        pp_Var1 = &handle->on_connect;
        handle->on_connect = on_connect;
        handle->connect_user_ctx = callback_ctx;
        handle->port_num = port_num;
        HVar6 = HTTP_CLIENT_OK;
        bVar3 = true;
        if (((handle->x509_cert != (char *)0x0) && (handle->x509_pk != (char *)0x0)) &&
           ((iVar4 = xio_setoption(handle->xio_handle,"x509certificate",handle->x509_cert),
            iVar4 != 0 ||
            (iVar4 = xio_setoption(handle->xio_handle,"x509privatekey",handle->x509_pk), iVar4 != 0)
            ))) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_open",0x4a5,1,"Failed setting x509 certificate");
          }
          free(handle->host_name);
          handle->host_name = (char *)0x0;
          handle->port_num = 0;
          *pp_Var1 = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
          handle->connect_user_ctx = (void *)0x0;
          HVar6 = HTTP_CLIENT_ERROR;
          bVar3 = false;
        }
        if (bVar3) {
          HVar6 = HTTP_CLIENT_OK;
          if ((handle->certificate != (char *)0x0) &&
             (iVar4 = xio_setoption(handle->xio_handle,"TrustedCerts",handle->certificate),
             iVar4 != 0)) {
            p_Var5 = xlogging_get_log_function();
            if (p_Var5 != (LOGGER_LOG)0x0) {
              (*p_Var5)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                        ,"uhttp_client_open",0x4b3,1,"Failed setting Trusted certificate");
            }
            free(handle->host_name);
            handle->host_name = (char *)0x0;
            handle->port_num = 0;
            *pp_Var1 = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
            handle->connect_user_ctx = (void *)0x0;
            HVar6 = HTTP_CLIENT_ERROR;
          }
        }
        if (HVar6 != HTTP_CLIENT_OK) {
          return HVar6;
        }
        iVar4 = xio_open(handle->xio_handle,on_xio_open_complete,handle,on_bytes_received,handle,
                         on_io_error,handle);
        if (iVar4 != 0) {
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                      ,"uhttp_client_open",0x4c2,1,"opening xio failed");
          }
          free(handle->host_name);
          handle->host_name = (char *)0x0;
          handle->port_num = 0;
          *pp_Var1 = (ON_HTTP_OPEN_COMPLETE_CALLBACK)0x0;
          handle->connect_user_ctx = (void *)0x0;
          (handle->recv_msg).recv_state = state_error;
          return HTTP_CLIENT_OPEN_FAILED;
        }
        return HTTP_CLIENT_OK;
      }
      p_Var5 = xlogging_get_log_function();
      HVar6 = HTTP_CLIENT_ERROR;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return HTTP_CLIENT_ERROR;
      }
      pcVar7 = "copying hostname has failed";
      iVar4 = 0x494;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      HVar6 = HTTP_CLIENT_INVALID_STATE;
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return HTTP_CLIENT_INVALID_STATE;
      }
      pcVar7 = "Unable to open previously open client.";
      iVar4 = 0x487;
    }
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c",
            "uhttp_client_open",iVar4,1,pcVar7);
  return HVar6;
}

Assistant:

HTTP_CLIENT_RESULT uhttp_client_open(HTTP_CLIENT_HANDLE handle, const char* host, int port_num, ON_HTTP_OPEN_COMPLETE_CALLBACK on_connect, void* callback_ctx)
{
    HTTP_CLIENT_RESULT result;
    if (handle == NULL || host == NULL)
    {
        /* Codes_SRS_UHTTP_07_006: [If handle, io_interface_desc or host is NULL then `uhttp_client_open` shall return HTTP_CLIENT_INVALID_ARG] */
        LogError("Invalid handle value");
        result = HTTP_CLIENT_INVALID_ARG;
    }
    else
    {
        HTTP_CLIENT_HANDLE_DATA* http_data = (HTTP_CLIENT_HANDLE_DATA*)handle;

        if ((http_data->recv_msg.recv_state != state_initial) &&
            (http_data->recv_msg.recv_state != state_error) &&
            (http_data->recv_msg.recv_state != state_closed))
        {
            LogError("Unable to open previously open client.");
            result = HTTP_CLIENT_INVALID_STATE;
        }
        else
        {
            if (http_data->host_name != NULL)
            {
                free(http_data->host_name);
                handle->host_name = NULL;
            }

            if (mallocAndStrcpy_s(&http_data->host_name, host) != 0)
            {
                LogError("copying hostname has failed");
                result = HTTP_CLIENT_ERROR;
            }
            /* Codes_SRS_UHTTP_07_007: [http_client_connect shall attempt to open the xio_handle. ] */
            else
            {
                result = HTTP_CLIENT_OK;
                http_data->recv_msg.recv_state = state_opening;
                http_data->on_connect = on_connect;
                http_data->connect_user_ctx = callback_ctx;
                http_data->port_num = port_num;

                if ((http_data->x509_cert != NULL) && (http_data->x509_pk != NULL))
                {
                    if ((xio_setoption(http_data->xio_handle, SU_OPTION_X509_CERT, http_data->x509_cert) != 0) ||
                        (xio_setoption(http_data->xio_handle, SU_OPTION_X509_PRIVATE_KEY, http_data->x509_pk) != 0))
                    {
                        LogError("Failed setting x509 certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if ((result == HTTP_CLIENT_OK) && (http_data->certificate != NULL))
                {
                    if (xio_setoption(http_data->xio_handle, OPTION_TRUSTED_CERT, http_data->certificate) != 0)
                    {
                        LogError("Failed setting Trusted certificate");
                        result = HTTP_CLIENT_ERROR;
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                    }
                }

                if (result == HTTP_CLIENT_OK)
                {
                    if (xio_open(http_data->xio_handle, on_xio_open_complete, http_data, on_bytes_received, http_data, on_io_error, http_data) != 0)
                    {
                        /* Codes_SRS_UHTTP_07_044: [ if a failure is encountered on xio_open uhttp_client_open shall return HTTP_CLIENT_OPEN_REQUEST_FAILED. ] */
                        LogError("opening xio failed");
                        free(http_data->host_name);
                        http_data->host_name = NULL;
                        http_data->on_connect = NULL;
                        http_data->connect_user_ctx = NULL;
                        http_data->port_num = 0;
                        http_data->recv_msg.recv_state = state_error;

                        result = HTTP_CLIENT_OPEN_FAILED;
                    }
                    else
                    {
                        /* Codes_SRS_UHTTP_07_008: [If http_client_connect succeeds then it shall return HTTP_CLIENT_OK] */
                        result = HTTP_CLIENT_OK;
                    }
                }
            }
        }
    }
    return result;
}